

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O3

int pospopcnt_u16_avx2_blend_popcnt_unroll4(uint16_t *array,uint32_t len,uint32_t *flags)

{
  int *piVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  byte bVar126;
  byte bVar127;
  byte bVar128;
  byte bVar129;
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  ulong uVar132;
  ulong uVar133;
  ulong uVar134;
  long lVar135;
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [64];
  undefined1 auVar141 [64];
  undefined1 auVar142 [64];
  undefined1 auVar143 [64];
  
  auVar131 = _DAT_001220c0;
  auVar130 = _DAT_001220a0;
  if (len < 0x40) {
    uVar134 = 0;
  }
  else {
    uVar133 = 0;
    uVar132 = 4;
    do {
      uVar134 = uVar132;
      lVar135 = 0x20;
      auVar138 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar133 * 0x10),auVar130,
                                   *(undefined1 (*) [32])(array + uVar133 * 0x10 + 0x10));
      auVar139 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar133 * 0x10 + 0x10),auVar131,
                                   *(undefined1 (*) [32])(array + uVar133 * 0x10));
      auVar136 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar133 * 0x10 + 0x20),auVar130,
                                   *(undefined1 (*) [32])(array + uVar133 * 0x10 + 0x30));
      auVar137 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar133 * 0x10 + 0x30),auVar131,
                                   *(undefined1 (*) [32])(array + uVar133 * 0x10 + 0x20));
      do {
        auVar2 = auVar138 >> 7;
        auVar6 = auVar138 >> 0xf;
        auVar25 = auVar138 >> 0x17;
        auVar45 = auVar138 >> 0x1f;
        auVar65 = auVar138 >> 0x27;
        auVar85 = auVar138 >> 0x2f;
        auVar105 = auVar138 >> 0x37;
        auVar125 = auVar138 >> 0x3f;
        auVar11 = auVar138 >> 0x47;
        auVar16 = auVar138 >> 0x4f;
        auVar21 = auVar138 >> 0x57;
        auVar26 = auVar138 >> 0x5f;
        auVar31 = auVar138 >> 0x67;
        auVar36 = auVar138 >> 0x6f;
        auVar41 = auVar138 >> 0x77;
        auVar46 = auVar138 >> 0x7f;
        auVar51 = auVar138 >> 0x87;
        auVar56 = auVar138 >> 0x8f;
        auVar61 = auVar138 >> 0x97;
        auVar66 = auVar138 >> 0x9f;
        auVar71 = auVar138 >> 0xa7;
        auVar76 = auVar138 >> 0xaf;
        auVar81 = auVar138 >> 0xb7;
        auVar86 = auVar138 >> 0xbf;
        auVar91 = auVar138 >> 199;
        auVar96 = auVar138 >> 0xcf;
        auVar101 = auVar138 >> 0xd7;
        auVar106 = auVar138 >> 0xdf;
        auVar111 = auVar138 >> 0xe7;
        auVar116 = auVar138 >> 0xef;
        auVar121 = auVar138 >> 0xf7;
        bVar126 = auVar138[0x1f];
        auVar3 = auVar139 >> 7;
        auVar10 = auVar139 >> 0xf;
        auVar30 = auVar139 >> 0x17;
        auVar50 = auVar139 >> 0x1f;
        auVar70 = auVar139 >> 0x27;
        auVar90 = auVar139 >> 0x2f;
        auVar110 = auVar139 >> 0x37;
        auVar7 = auVar139 >> 0x3f;
        auVar12 = auVar139 >> 0x47;
        auVar17 = auVar139 >> 0x4f;
        auVar22 = auVar139 >> 0x57;
        auVar27 = auVar139 >> 0x5f;
        auVar32 = auVar139 >> 0x67;
        auVar37 = auVar139 >> 0x6f;
        auVar42 = auVar139 >> 0x77;
        auVar47 = auVar139 >> 0x7f;
        auVar52 = auVar139 >> 0x87;
        auVar57 = auVar139 >> 0x8f;
        auVar62 = auVar139 >> 0x97;
        auVar67 = auVar139 >> 0x9f;
        auVar72 = auVar139 >> 0xa7;
        auVar77 = auVar139 >> 0xaf;
        auVar82 = auVar139 >> 0xb7;
        auVar87 = auVar139 >> 0xbf;
        auVar92 = auVar139 >> 199;
        auVar97 = auVar139 >> 0xcf;
        auVar102 = auVar139 >> 0xd7;
        auVar107 = auVar139 >> 0xdf;
        auVar112 = auVar139 >> 0xe7;
        auVar117 = auVar139 >> 0xef;
        auVar122 = auVar139 >> 0xf7;
        bVar127 = auVar139[0x1f];
        auVar4 = auVar136 >> 7;
        auVar15 = auVar136 >> 0xf;
        auVar35 = auVar136 >> 0x17;
        auVar55 = auVar136 >> 0x1f;
        auVar75 = auVar136 >> 0x27;
        auVar95 = auVar136 >> 0x2f;
        auVar115 = auVar136 >> 0x37;
        auVar8 = auVar136 >> 0x3f;
        auVar13 = auVar136 >> 0x47;
        auVar18 = auVar136 >> 0x4f;
        auVar23 = auVar136 >> 0x57;
        auVar28 = auVar136 >> 0x5f;
        auVar33 = auVar136 >> 0x67;
        auVar38 = auVar136 >> 0x6f;
        auVar43 = auVar136 >> 0x77;
        auVar48 = auVar136 >> 0x7f;
        auVar53 = auVar136 >> 0x87;
        auVar58 = auVar136 >> 0x8f;
        auVar63 = auVar136 >> 0x97;
        auVar68 = auVar136 >> 0x9f;
        auVar73 = auVar136 >> 0xa7;
        auVar78 = auVar136 >> 0xaf;
        auVar83 = auVar136 >> 0xb7;
        auVar88 = auVar136 >> 0xbf;
        auVar93 = auVar136 >> 199;
        auVar98 = auVar136 >> 0xcf;
        auVar103 = auVar136 >> 0xd7;
        auVar108 = auVar136 >> 0xdf;
        auVar113 = auVar136 >> 0xe7;
        auVar118 = auVar136 >> 0xef;
        auVar123 = auVar136 >> 0xf7;
        bVar128 = auVar136[0x1f];
        auVar138 = vpaddb_avx2(auVar138,auVar138);
        auVar139 = vpaddb_avx2(auVar139,auVar139);
        auVar136 = vpaddb_avx2(auVar136,auVar136);
        auVar5 = auVar137 >> 7;
        auVar20 = auVar137 >> 0xf;
        auVar40 = auVar137 >> 0x17;
        auVar60 = auVar137 >> 0x1f;
        auVar80 = auVar137 >> 0x27;
        auVar100 = auVar137 >> 0x2f;
        auVar120 = auVar137 >> 0x37;
        auVar9 = auVar137 >> 0x3f;
        auVar14 = auVar137 >> 0x47;
        auVar19 = auVar137 >> 0x4f;
        auVar24 = auVar137 >> 0x57;
        auVar29 = auVar137 >> 0x5f;
        auVar34 = auVar137 >> 0x67;
        auVar39 = auVar137 >> 0x6f;
        auVar44 = auVar137 >> 0x77;
        auVar49 = auVar137 >> 0x7f;
        auVar54 = auVar137 >> 0x87;
        auVar59 = auVar137 >> 0x8f;
        auVar64 = auVar137 >> 0x97;
        auVar69 = auVar137 >> 0x9f;
        auVar74 = auVar137 >> 0xa7;
        auVar79 = auVar137 >> 0xaf;
        auVar84 = auVar137 >> 0xb7;
        auVar89 = auVar137 >> 0xbf;
        auVar94 = auVar137 >> 199;
        auVar99 = auVar137 >> 0xcf;
        auVar104 = auVar137 >> 0xd7;
        auVar109 = auVar137 >> 0xdf;
        auVar114 = auVar137 >> 0xe7;
        auVar119 = auVar137 >> 0xef;
        auVar124 = auVar137 >> 0xf7;
        bVar129 = auVar137[0x1f];
        auVar137 = vpaddb_avx2(auVar137,auVar137);
        *(int *)((long)flags + lVar135 + -4) =
             POPCOUNT((uint)(auVar4[0] & 1) | (uint)(auVar15[0] & 1) << 1 |
                      (uint)(auVar35[0] & 1) << 2 | (uint)(auVar55[0] & 1) << 3 |
                      (uint)(auVar75[0] & 1) << 4 | (uint)(auVar95[0] & 1) << 5 |
                      (uint)(auVar115[0] & 1) << 6 | (uint)(auVar8[0] & 1) << 7 |
                      (uint)(auVar13[0] & 1) << 8 | (uint)(auVar18[0] & 1) << 9 |
                      (uint)(auVar23[0] & 1) << 10 | (uint)(auVar28[0] & 1) << 0xb |
                      (uint)(auVar33[0] & 1) << 0xc | (uint)(auVar38[0] & 1) << 0xd |
                      (uint)(auVar43[0] & 1) << 0xe | (uint)auVar48[0] << 0xf |
                      (uint)(auVar53[0] & 1) << 0x10 | (uint)(auVar58[0] & 1) << 0x11 |
                      (uint)(auVar63[0] & 1) << 0x12 | (uint)(auVar68[0] & 1) << 0x13 |
                      (uint)(auVar73[0] & 1) << 0x14 | (uint)(auVar78[0] & 1) << 0x15 |
                      (uint)(auVar83[0] & 1) << 0x16 | (uint)auVar88[0] << 0x17 |
                      (uint)(auVar93[0] & 1) << 0x18 | (uint)(auVar98[0] & 1) << 0x19 |
                      (uint)(auVar103[0] & 1) << 0x1a | (uint)(auVar108[0] & 1) << 0x1b |
                      (uint)(auVar113[0] & 1) << 0x1c | (uint)(auVar118[0] & 1) << 0x1d |
                      (uint)(auVar123[0] & 1) << 0x1e | (uint)(bVar128 >> 7) << 0x1f) +
             POPCOUNT((uint)(auVar2[0] & 1) | (uint)(auVar6[0] & 1) << 1 |
                      (uint)(auVar25[0] & 1) << 2 | (uint)(auVar45[0] & 1) << 3 |
                      (uint)(auVar65[0] & 1) << 4 | (uint)(auVar85[0] & 1) << 5 |
                      (uint)(auVar105[0] & 1) << 6 | (uint)(auVar125[0] & 1) << 7 |
                      (uint)(auVar11[0] & 1) << 8 | (uint)(auVar16[0] & 1) << 9 |
                      (uint)(auVar21[0] & 1) << 10 | (uint)(auVar26[0] & 1) << 0xb |
                      (uint)(auVar31[0] & 1) << 0xc | (uint)(auVar36[0] & 1) << 0xd |
                      (uint)(auVar41[0] & 1) << 0xe | (uint)auVar46[0] << 0xf |
                      (uint)(auVar51[0] & 1) << 0x10 | (uint)(auVar56[0] & 1) << 0x11 |
                      (uint)(auVar61[0] & 1) << 0x12 | (uint)(auVar66[0] & 1) << 0x13 |
                      (uint)(auVar71[0] & 1) << 0x14 | (uint)(auVar76[0] & 1) << 0x15 |
                      (uint)(auVar81[0] & 1) << 0x16 | (uint)auVar86[0] << 0x17 |
                      (uint)(auVar91[0] & 1) << 0x18 | (uint)(auVar96[0] & 1) << 0x19 |
                      (uint)(auVar101[0] & 1) << 0x1a | (uint)(auVar106[0] & 1) << 0x1b |
                      (uint)(auVar111[0] & 1) << 0x1c | (uint)(auVar116[0] & 1) << 0x1d |
                      (uint)(auVar121[0] & 1) << 0x1e | (uint)(bVar126 >> 7) << 0x1f) +
             *(int *)((long)flags + lVar135 + -4);
        *(int *)((long)flags + lVar135 + 0x1c) =
             POPCOUNT((uint)(auVar5[0] & 1) | (uint)(auVar20[0] & 1) << 1 |
                      (uint)(auVar40[0] & 1) << 2 | (uint)(auVar60[0] & 1) << 3 |
                      (uint)(auVar80[0] & 1) << 4 | (uint)(auVar100[0] & 1) << 5 |
                      (uint)(auVar120[0] & 1) << 6 | (uint)(auVar9[0] & 1) << 7 |
                      (uint)(auVar14[0] & 1) << 8 | (uint)(auVar19[0] & 1) << 9 |
                      (uint)(auVar24[0] & 1) << 10 | (uint)(auVar29[0] & 1) << 0xb |
                      (uint)(auVar34[0] & 1) << 0xc | (uint)(auVar39[0] & 1) << 0xd |
                      (uint)(auVar44[0] & 1) << 0xe | (uint)auVar49[0] << 0xf |
                      (uint)(auVar54[0] & 1) << 0x10 | (uint)(auVar59[0] & 1) << 0x11 |
                      (uint)(auVar64[0] & 1) << 0x12 | (uint)(auVar69[0] & 1) << 0x13 |
                      (uint)(auVar74[0] & 1) << 0x14 | (uint)(auVar79[0] & 1) << 0x15 |
                      (uint)(auVar84[0] & 1) << 0x16 | (uint)auVar89[0] << 0x17 |
                      (uint)(auVar94[0] & 1) << 0x18 | (uint)(auVar99[0] & 1) << 0x19 |
                      (uint)(auVar104[0] & 1) << 0x1a | (uint)(auVar109[0] & 1) << 0x1b |
                      (uint)(auVar114[0] & 1) << 0x1c | (uint)(auVar119[0] & 1) << 0x1d |
                      (uint)(auVar124[0] & 1) << 0x1e | (uint)(bVar129 >> 7) << 0x1f) +
             POPCOUNT((uint)(auVar3[0] & 1) | (uint)(auVar10[0] & 1) << 1 |
                      (uint)(auVar30[0] & 1) << 2 | (uint)(auVar50[0] & 1) << 3 |
                      (uint)(auVar70[0] & 1) << 4 | (uint)(auVar90[0] & 1) << 5 |
                      (uint)(auVar110[0] & 1) << 6 | (uint)(auVar7[0] & 1) << 7 |
                      (uint)(auVar12[0] & 1) << 8 | (uint)(auVar17[0] & 1) << 9 |
                      (uint)(auVar22[0] & 1) << 10 | (uint)(auVar27[0] & 1) << 0xb |
                      (uint)(auVar32[0] & 1) << 0xc | (uint)(auVar37[0] & 1) << 0xd |
                      (uint)(auVar42[0] & 1) << 0xe | (uint)auVar47[0] << 0xf |
                      (uint)(auVar52[0] & 1) << 0x10 | (uint)(auVar57[0] & 1) << 0x11 |
                      (uint)(auVar62[0] & 1) << 0x12 | (uint)(auVar67[0] & 1) << 0x13 |
                      (uint)(auVar72[0] & 1) << 0x14 | (uint)(auVar77[0] & 1) << 0x15 |
                      (uint)(auVar82[0] & 1) << 0x16 | (uint)auVar87[0] << 0x17 |
                      (uint)(auVar92[0] & 1) << 0x18 | (uint)(auVar97[0] & 1) << 0x19 |
                      (uint)(auVar102[0] & 1) << 0x1a | (uint)(auVar107[0] & 1) << 0x1b |
                      (uint)(auVar112[0] & 1) << 0x1c | (uint)(auVar117[0] & 1) << 0x1d |
                      (uint)(auVar122[0] & 1) << 0x1e | (uint)(bVar127 >> 7) << 0x1f) +
             *(int *)((long)flags + lVar135 + 0x1c);
        lVar135 = lVar135 + -4;
      } while (lVar135 != 0);
      uVar133 = uVar134;
      uVar132 = uVar134 + 4;
    } while (uVar134 + 4 <= (ulong)(len >> 4));
  }
  auVar131 = _DAT_001220c0;
  auVar130 = _DAT_001220a0;
  uVar133 = uVar134 | 2;
  while (uVar132 = uVar133, uVar132 <= len >> 4) {
    lVar135 = 0x20;
    auVar138 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar134 * 0x10),auVar130,
                                 *(undefined1 (*) [32])(array + uVar134 * 0x10 + 0x10));
    auVar139 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar134 * 0x10 + 0x10),auVar131,
                                 *(undefined1 (*) [32])(array + uVar134 * 0x10));
    do {
      auVar136 = auVar138 >> 7;
      auVar137 = auVar138 >> 0xf;
      auVar2 = auVar138 >> 0x17;
      auVar3 = auVar138 >> 0x1f;
      auVar4 = auVar138 >> 0x27;
      auVar5 = auVar138 >> 0x2f;
      auVar6 = auVar138 >> 0x37;
      auVar10 = auVar138 >> 0x3f;
      auVar15 = auVar138 >> 0x47;
      auVar20 = auVar138 >> 0x4f;
      auVar25 = auVar138 >> 0x57;
      auVar30 = auVar138 >> 0x5f;
      auVar35 = auVar138 >> 0x67;
      auVar40 = auVar138 >> 0x6f;
      auVar45 = auVar138 >> 0x77;
      auVar50 = auVar138 >> 0x7f;
      auVar55 = auVar138 >> 0x87;
      auVar60 = auVar138 >> 0x8f;
      auVar65 = auVar138 >> 0x97;
      auVar70 = auVar138 >> 0x9f;
      auVar75 = auVar138 >> 0xa7;
      auVar80 = auVar138 >> 0xaf;
      auVar85 = auVar138 >> 0xb7;
      auVar90 = auVar138 >> 0xbf;
      auVar95 = auVar138 >> 199;
      auVar100 = auVar138 >> 0xcf;
      auVar105 = auVar138 >> 0xd7;
      auVar110 = auVar138 >> 0xdf;
      auVar115 = auVar138 >> 0xe7;
      auVar120 = auVar138 >> 0xef;
      auVar125 = auVar138 >> 0xf7;
      bVar126 = auVar138[0x1f];
      auVar138 = vpaddb_avx2(auVar138,auVar138);
      piVar1 = (int *)((long)flags + lVar135 + -4);
      *piVar1 = *piVar1 + POPCOUNT((uint)(auVar136[0] & 1) | (uint)(auVar137[0] & 1) << 1 |
                                   (uint)(auVar2[0] & 1) << 2 | (uint)(auVar3[0] & 1) << 3 |
                                   (uint)(auVar4[0] & 1) << 4 | (uint)(auVar5[0] & 1) << 5 |
                                   (uint)(auVar6[0] & 1) << 6 | (uint)(auVar10[0] & 1) << 7 |
                                   (uint)(auVar15[0] & 1) << 8 | (uint)(auVar20[0] & 1) << 9 |
                                   (uint)(auVar25[0] & 1) << 10 | (uint)(auVar30[0] & 1) << 0xb |
                                   (uint)(auVar35[0] & 1) << 0xc | (uint)(auVar40[0] & 1) << 0xd |
                                   (uint)(auVar45[0] & 1) << 0xe | (uint)auVar50[0] << 0xf |
                                   (uint)(auVar55[0] & 1) << 0x10 | (uint)(auVar60[0] & 1) << 0x11 |
                                   (uint)(auVar65[0] & 1) << 0x12 | (uint)(auVar70[0] & 1) << 0x13 |
                                   (uint)(auVar75[0] & 1) << 0x14 | (uint)(auVar80[0] & 1) << 0x15 |
                                   (uint)(auVar85[0] & 1) << 0x16 | (uint)auVar90[0] << 0x17 |
                                   (uint)(auVar95[0] & 1) << 0x18 | (uint)(auVar100[0] & 1) << 0x19
                                   | (uint)(auVar105[0] & 1) << 0x1a |
                                   (uint)(auVar110[0] & 1) << 0x1b | (uint)(auVar115[0] & 1) << 0x1c
                                   | (uint)(auVar120[0] & 1) << 0x1d |
                                   (uint)(auVar125[0] & 1) << 0x1e | (uint)(bVar126 >> 7) << 0x1f);
      auVar136 = auVar139 >> 7;
      auVar137 = auVar139 >> 0xf;
      auVar2 = auVar139 >> 0x17;
      auVar3 = auVar139 >> 0x1f;
      auVar4 = auVar139 >> 0x27;
      auVar5 = auVar139 >> 0x2f;
      auVar6 = auVar139 >> 0x37;
      auVar10 = auVar139 >> 0x3f;
      auVar15 = auVar139 >> 0x47;
      auVar20 = auVar139 >> 0x4f;
      auVar25 = auVar139 >> 0x57;
      auVar30 = auVar139 >> 0x5f;
      auVar35 = auVar139 >> 0x67;
      auVar40 = auVar139 >> 0x6f;
      auVar45 = auVar139 >> 0x77;
      auVar50 = auVar139 >> 0x7f;
      auVar55 = auVar139 >> 0x87;
      auVar60 = auVar139 >> 0x8f;
      auVar65 = auVar139 >> 0x97;
      auVar70 = auVar139 >> 0x9f;
      auVar75 = auVar139 >> 0xa7;
      auVar80 = auVar139 >> 0xaf;
      auVar85 = auVar139 >> 0xb7;
      auVar90 = auVar139 >> 0xbf;
      auVar95 = auVar139 >> 199;
      auVar100 = auVar139 >> 0xcf;
      auVar105 = auVar139 >> 0xd7;
      auVar110 = auVar139 >> 0xdf;
      auVar115 = auVar139 >> 0xe7;
      auVar120 = auVar139 >> 0xef;
      auVar125 = auVar139 >> 0xf7;
      bVar126 = auVar139[0x1f];
      auVar139 = vpaddb_avx2(auVar139,auVar139);
      piVar1 = (int *)((long)flags + lVar135 + 0x1c);
      *piVar1 = *piVar1 + POPCOUNT((uint)(auVar136[0] & 1) | (uint)(auVar137[0] & 1) << 1 |
                                   (uint)(auVar2[0] & 1) << 2 | (uint)(auVar3[0] & 1) << 3 |
                                   (uint)(auVar4[0] & 1) << 4 | (uint)(auVar5[0] & 1) << 5 |
                                   (uint)(auVar6[0] & 1) << 6 | (uint)(auVar10[0] & 1) << 7 |
                                   (uint)(auVar15[0] & 1) << 8 | (uint)(auVar20[0] & 1) << 9 |
                                   (uint)(auVar25[0] & 1) << 10 | (uint)(auVar30[0] & 1) << 0xb |
                                   (uint)(auVar35[0] & 1) << 0xc | (uint)(auVar40[0] & 1) << 0xd |
                                   (uint)(auVar45[0] & 1) << 0xe | (uint)auVar50[0] << 0xf |
                                   (uint)(auVar55[0] & 1) << 0x10 | (uint)(auVar60[0] & 1) << 0x11 |
                                   (uint)(auVar65[0] & 1) << 0x12 | (uint)(auVar70[0] & 1) << 0x13 |
                                   (uint)(auVar75[0] & 1) << 0x14 | (uint)(auVar80[0] & 1) << 0x15 |
                                   (uint)(auVar85[0] & 1) << 0x16 | (uint)auVar90[0] << 0x17 |
                                   (uint)(auVar95[0] & 1) << 0x18 | (uint)(auVar100[0] & 1) << 0x19
                                   | (uint)(auVar105[0] & 1) << 0x1a |
                                   (uint)(auVar110[0] & 1) << 0x1b | (uint)(auVar115[0] & 1) << 0x1c
                                   | (uint)(auVar120[0] & 1) << 0x1d |
                                   (uint)(auVar125[0] & 1) << 0x1e | (uint)(bVar126 >> 7) << 0x1f);
      lVar135 = lVar135 + -4;
    } while (lVar135 != 0);
    uVar134 = uVar132;
    uVar133 = uVar132 + 2;
  }
  uVar134 = uVar134 << 4;
  if (uVar134 < len) {
    auVar140 = vmovdqu64_avx512f(*(undefined1 (*) [64])flags);
    auVar141 = vpmovsxbd_avx512f(_DAT_0011f080);
    auVar142 = vpbroadcastd_avx512f(ZEXT416(1));
    do {
      uVar134 = uVar134 + 1;
      auVar143 = vpbroadcastd_avx512f();
      auVar143 = vpsrlvd_avx512f(auVar143,auVar141);
      auVar143 = vpandd_avx512f(auVar143,auVar142);
      auVar140 = vpaddd_avx512f(auVar143,auVar140);
    } while (len != uVar134);
    auVar140 = vmovdqu64_avx512f(auVar140);
    *(undefined1 (*) [64])flags = auVar140;
  }
  return 0;
}

Assistant:

int pospopcnt_u16_avx2_blend_popcnt_unroll4(const uint16_t* array, uint32_t len, uint32_t* flags) {
    const __m256i* data_vectors = (const __m256i*)(array);
    const uint32_t n_cycles = len / 16;

    size_t i = 0;
    for (/**/; i + 4 <= n_cycles; i += 4) {
#define L(p) __m256i v##p = _mm256_loadu_si256(data_vectors+i+p);
        L(0) L(1) L(2) L(3)
        
#define U0(p,k) __m256i input##p = _mm256_or_si256(_mm256_and_si256(v##p, _mm256_set1_epi16(0x00FF)), _mm256_slli_epi16(v##k, 8));
#define U1(p,k) __m256i input##k = _mm256_or_si256(_mm256_and_si256(v##p, _mm256_set1_epi16((int16_t)0xFF00)), _mm256_srli_epi16(v##k, 8));
#define U(p, k)  U0(p,k) U1(p,k)
       U(0,1) U(2, 3)
        
        for (int i = 0; i < 8; ++i) {
#define A0(p) flags[ 7 - i] += _mm_popcnt_u32(_mm256_movemask_epi8(input##p));
#define A1(k) flags[15 - i] += _mm_popcnt_u32(_mm256_movemask_epi8(input##k));
#define A(p, k) A0(p) A1(k)
            A(0,1) A(2, 3)

#define P0(p) input##p = _mm256_add_epi8(input##p, input##p);
#define P(p, k) P0(p) P0(k)
            P(0,1) P(2, 3)
        }
    }

    for (/**/; i + 2 <= n_cycles; i += 2) {
        L(0) L(1)
        U(0,1)
        
        for (int i = 0; i < 8; ++i) {
            A(0,1)
            P(0,1)
        }
    }

    i *= 16;
    for (/**/; i < len; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += ((array[i] & (1 << j)) >> j);
        }
    }

#undef L
#undef U0
#undef U1
#undef U
#undef A0
#undef A1
#undef A
#undef P0
#undef P
    
    return 0;
}